

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

char * __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::TryAllocFromZeroPagesList
          (PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           *this,uint pageCount,PageSegmentBase<Memory::VirtualAllocWrapper> **pageSegment,
          BackgroundPageQueue *bgPageQueue,bool isPendingZeroList)

{
  uint uVar1;
  FreePageEntry *pFVar2;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  code *pcVar3;
  bool bVar4;
  DWORD DVar5;
  FreePageEntry *pFVar6;
  undefined4 *puVar7;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  ThreadContextId pvVar8;
  size_t __n;
  FreePageEntry *address;
  uint uVar9;
  uint local_3c;
  
  if (DAT_0145c440 == '\x01') {
    address = (FreePageEntry *)0x0;
    do {
      if (isPendingZeroList) {
        pFVar6 = ZeroPageQueue::PopZeroPageEntry((ZeroPageQueue *)this->backgroundPageQueue);
      }
      else {
        pFVar6 = BackgroundPageQueue::PopFreePageEntry(this->backgroundPageQueue);
      }
      if (pFVar6 == (FreePageEntry *)0x0) {
LAB_0066c6d7:
        if (address == (FreePageEntry *)0x0) {
          return (char *)pFVar6;
        }
        goto LAB_0066c6e3;
      }
      uVar1 = pFVar6->pageCount;
      if (uVar1 == pageCount) {
        *pageSegment = pFVar6->segment;
        __n = 0x18;
        if (isPendingZeroList) {
          __n = (ulong)(pageCount << 0xc);
        }
        memset(pFVar6,0,__n);
        FillAllocPages(this,pFVar6,pageCount);
        goto LAB_0066c6d7;
      }
      if (isPendingZeroList) {
        memset(pFVar6 + 1,0,(ulong)(uVar1 << 0xc) - 0x18);
      }
      pFVar6->Next = address;
      uVar9 = uVar1 - pageCount;
      address = pFVar6;
    } while (uVar1 < pageCount || uVar9 == 0);
    *pageSegment = pFVar6->segment;
    pFVar6->pageCount = uVar9;
    pFVar6 = (FreePageEntry *)((long)&pFVar6->Next + (ulong)(uVar9 * 0x1000));
    FillAllocPages(this,pFVar6,pageCount);
LAB_0066c6e3:
    local_3c = 0;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    while (address != (FreePageEntry *)0x0) {
      pFVar2 = address->Next;
      segment = address->segment;
      uVar9 = address->pageCount;
      fromSegmentList = GetSegmentList(this,segment);
      if (fromSegmentList ==
          (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x3b2,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      address->Next = (FreePageEntry *)0x0;
      address->segment = (PageSegmentBase<Memory::VirtualAllocWrapper> *)0x0;
      *(undefined8 *)&address->pageCount = 0;
      PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages(segment,address,uVar9);
      local_3c = local_3c + uVar9;
      TransferSegment(this,segment,fromSegmentList);
      address = pFVar2;
    }
    LogFreePages(this,(ulong)local_3c);
    bVar4 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if ((bVar4) && (this->pageAllocatorFlagTable->Verbose == true)) {
      pvVar8 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar5 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar8,(ulong)DVar5,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      Output::Print(L"New free pages: %d\n",(ulong)local_3c);
      Output::Print(L"\n");
      Output::Flush();
    }
    AddFreePageCount(this,local_3c);
    if (this->freePageCount < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = this->freePageCount;
    }
  }
  else {
    pFVar6 = (FreePageEntry *)0x0;
  }
  return (char *)pFVar6;
}

Assistant:

char *
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TryAllocFromZeroPagesList(
    uint pageCount, TPageSegment ** pageSegment, BackgroundPageQueue* bgPageQueue, bool isPendingZeroList)
{
    FAULTINJECT_MEMORY_NOTHROW(this->debugName, pageCount*AutoSystemInfo::PageSize);

    char * pages = nullptr;
    FreePageEntry* localList = nullptr;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        while (true)
        {
            FreePageEntry * freePage = isPendingZeroList ? ((ZeroPageQueue *)backgroundPageQueue)->PopZeroPageEntry() : backgroundPageQueue->PopFreePageEntry();
            if (freePage == nullptr)
            {
                break;
            }

            if (freePage->pageCount == pageCount)
            {
                *pageSegment = freePage->segment;
                pages = (char *)freePage;
                memset(pages, 0, isPendingZeroList ? (pageCount*AutoSystemInfo::PageSize) : sizeof(FreePageEntry));
                this->FillAllocPages(pages, pageCount);
                break;
            }
            else
            {
                if (isPendingZeroList)
                {
                    memset((char *)freePage + sizeof(FreePageEntry), 0, (freePage->pageCount*AutoSystemInfo::PageSize) - sizeof(FreePageEntry));
                }

                freePage->Next = localList;
                localList = (FreePageEntry*)freePage;

                if (freePage->pageCount > pageCount)
                {
                    *pageSegment = freePage->segment;
                    freePage->pageCount -= pageCount;
                    pages = (char *)freePage + freePage->pageCount * AutoSystemInfo::PageSize;
                    this->FillAllocPages(pages, pageCount);
                    break;
                }
            }
        }
    }
#endif

    if (localList != nullptr)
    {
        uint newFreePages = 0;
        while (localList != nullptr)
        {
            FreePageEntry* freePagesEntry = localList;
            localList = (FreePageEntry*)localList->Next;

            TPageSegment * segment = freePagesEntry->segment;
            pageCount = freePagesEntry->pageCount;

            DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
            Assert(fromSegmentList != nullptr);

            memset(freePagesEntry, 0, sizeof(FreePageEntry));

            segment->ReleasePages(freePagesEntry, pageCount);
            newFreePages += pageCount;

            TransferSegment(segment, fromSegmentList);

        }

        LogFreePages(newFreePages);
        PAGE_ALLOC_VERBOSE_TRACE(_u("New free pages: %d\n"), newFreePages);
        this->AddFreePageCount(newFreePages);
#if DBG
        UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
#endif
    }

    return pages;
}